

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O1

void __thiscall duckdb_re2::Regexp::~Regexp(Regexp *this)

{
  uint8_t uVar1;
  undefined8 *puVar2;
  ostringstream local_188 [112];
  ios_base local_118 [264];
  
  if (this->nsub_ != 0) {
    std::__cxx11::ostringstream::ostringstream(local_188);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_188,"Regexp not destroyed.",0x15);
    std::__cxx11::ostringstream::~ostringstream(local_188);
    std::ios_base::~ios_base(local_118);
  }
  uVar1 = this->op_;
  if (uVar1 == '\x04') {
    if ((this->arguments).the_union_[1] != (void *)0x0) {
      operator_delete__((this->arguments).the_union_[1]);
    }
  }
  else {
    if (uVar1 == '\x14') {
      if ((this->arguments).the_union_[0] != (void *)0x0) {
        operator_delete__((this->arguments).the_union_[0]);
      }
      puVar2 = (undefined8 *)(this->arguments).the_union_[1];
      if (puVar2 == (undefined8 *)0x0) {
        return;
      }
      std::
      _Rb_tree<duckdb_re2::RuneRange,_duckdb_re2::RuneRange,_std::_Identity<duckdb_re2::RuneRange>,_duckdb_re2::RuneRangeLess,_std::allocator<duckdb_re2::RuneRange>_>
      ::~_Rb_tree((_Rb_tree<duckdb_re2::RuneRange,_duckdb_re2::RuneRange,_std::_Identity<duckdb_re2::RuneRange>,_duckdb_re2::RuneRangeLess,_std::allocator<duckdb_re2::RuneRange>_>
                   *)(puVar2 + 2));
    }
    else {
      if (uVar1 != '\v') {
        return;
      }
      puVar2 = (undefined8 *)(this->arguments).the_union_[1];
      if (puVar2 == (undefined8 *)0x0) {
        return;
      }
      if ((undefined8 *)*puVar2 != puVar2 + 2) {
        operator_delete((undefined8 *)*puVar2);
      }
    }
    operator_delete(puVar2);
  }
  return;
}

Assistant:

Regexp::~Regexp() {
  if (nsub_ > 0)
    LOG(DFATAL) << "Regexp not destroyed.";

  switch (op_) {
    default:
      break;
    case kRegexpCapture:
      delete arguments.capture.name_;
      break;
    case kRegexpLiteralString:
      delete[] arguments.literal_string.runes_;
      break;
    case kRegexpCharClass:
      if (arguments.char_class.cc_)
		  arguments.char_class.cc_->Delete();
      delete arguments.char_class.ccb_;
      break;
  }
}